

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketUtils.cpp
# Opt level: O0

ssize_t readn(int fd,void *buff,size_t n)

{
  int *piVar1;
  char *local_40;
  char *buf;
  ssize_t nread;
  size_t nleft;
  size_t n_local;
  void *buff_local;
  int fd_local;
  
  local_40 = (char *)buff;
  nread = n;
  do {
    if (nread == 0) {
LAB_0016d410:
      return n - nread;
    }
    buf = (char *)read(fd,local_40,nread);
    if ((long)buf < 0) {
      piVar1 = __errno_location();
      if (*piVar1 != 4) {
        piVar1 = __errno_location();
        if (*piVar1 != 0xb) {
          return -1;
        }
        goto LAB_0016d410;
      }
      buf = (char *)0x0;
    }
    else if (buf == (char *)0x0) goto LAB_0016d410;
    nread = nread - (long)buf;
    local_40 = buf + (long)local_40;
  } while( true );
}

Assistant:

ssize_t readn(int fd, void* buff, size_t n) {
    size_t nleft = n;
    ssize_t nread = 0;
    char* buf = (char*)buff;
    
    while (nleft > 0) {
        if ((nread = read(fd, buf, nleft)) < 0) {
            if (errno == EINTR) {
                nread = 0;
            } else if (errno == EAGAIN) {
                break;
            } else {
                return -1;   
            }
        } else if (nread == 0) {
            break;
        }
        
        nleft -= nread;
        buf += nread;
    }
    return n - nleft;
}